

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O2

WJTL_STATUS VerifyJsonParsesAsDictionaryOfNumbers(_Bool IsJson5,char *Json,size_t NumItems)

{
  JL_DATA_TYPE JVar1;
  JL_STATUS JVar2;
  JL_STATUS JVar3;
  ulong uVar4;
  bool Condition;
  WJTL_STATUS local_64;
  uint64_t u64;
  JlDataObject *object;
  JlDataObject *dictionaryObject;
  char itemName [16];
  size_t errorAtPos;
  
  dictionaryObject = (JlDataObject *)0x0;
  errorAtPos = 100;
  local_64 = JlParseJsonEx(Json,IsJson5,&dictionaryObject,&errorAtPos);
  Condition = local_64 == WJTL_STATUS_SUCCESS;
  if (!Condition) {
    local_64 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(Condition,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsDictionaryOfNumbers",0x379);
  if (dictionaryObject != (JlDataObject *)0x0) {
    JVar1 = JlGetObjectType(dictionaryObject);
    if (JVar1 != JL_DATA_TYPE_DICTIONARY) {
      local_64 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(JVar1 == JL_DATA_TYPE_DICTIONARY,
                     "JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfNumbers",0x37c);
    for (uVar4 = 1; uVar4 - NumItems != 1; uVar4 = uVar4 + 1) {
      object = (JlDataObject *)0x0;
      u64 = 0;
      itemName[0] = '\0';
      itemName[1] = '\0';
      itemName[2] = '\0';
      itemName[3] = '\0';
      itemName[4] = '\0';
      itemName[5] = '\0';
      itemName[6] = '\0';
      itemName[7] = '\0';
      itemName[8] = '\0';
      itemName[9] = '\0';
      itemName[10] = '\0';
      itemName[0xb] = '\0';
      itemName[0xc] = '\0';
      itemName[0xd] = '\0';
      itemName[0xe] = '\0';
      itemName[0xf] = '\0';
      sprintf(itemName,"item%u",uVar4 & 0xffffffff);
      JVar2 = JlGetObjectFromDictionaryByKey(dictionaryObject,itemName,&object);
      WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsDictionaryOfNumbers",0x385);
      JVar3 = JlGetObjectNumberU64(object,&u64);
      WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsDictionaryOfNumbers",0x386);
      if (uVar4 != u64) {
        local_64 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(uVar4 == u64,"u64 == num",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsDictionaryOfNumbers",0x387);
      if (JVar3 != JL_STATUS_SUCCESS || JVar2 != JL_STATUS_SUCCESS) {
        local_64 = WJTL_STATUS_FAILED;
      }
    }
    JVar2 = JlFreeObjectTree(&dictionaryObject);
    if (JVar2 != JL_STATUS_SUCCESS) {
      local_64 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &dictionaryObject ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfNumbers",0x38b);
  }
  return local_64;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsDictionaryOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        size_t          NumItems
    )
{
    JlDataObject*   dictionaryObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ) );
    if( NULL == dictionaryObject ) { return TestReturn; }

    JL_ASSERT( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY );

    for( size_t num=1; num<=NumItems; num++ )
    {
        JlDataObject* object = NULL;
        uint64_t u64 = 0;
        char itemName [16] = {0};
        sprintf( itemName, "item%u", (uint32_t)num );

        JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ) );
        JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
        JL_ASSERT( u64 == num );
    }

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &dictionaryObject ) );

    return TestReturn;
}